

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O1

int mbedtls_aes_crypt_cfb128
              (mbedtls_aes_context *ctx,int mode,size_t length,size_t *iv_off,uchar *iv,uchar *input
              ,uchar *output)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  
  uVar4 = *iv_off;
  iVar3 = -0x21;
  if (uVar4 < 0x10) {
    if (mode == 0) {
      if (length != 0) {
        sVar5 = 0;
        do {
          if (uVar4 == 0) {
            mbedtls_aes_crypt_ecb(ctx,1,iv,iv);
          }
          bVar1 = input[sVar5];
          output[sVar5] = iv[uVar4] ^ bVar1;
          iv[uVar4] = bVar1;
          uVar4 = (ulong)((int)uVar4 + 1U & 0xf);
          sVar5 = sVar5 + 1;
        } while (length != sVar5);
      }
    }
    else if (length != 0) {
      sVar5 = 0;
      do {
        if (uVar4 == 0) {
          mbedtls_aes_crypt_ecb(ctx,1,iv,iv);
        }
        bVar1 = input[sVar5];
        bVar2 = iv[uVar4];
        output[sVar5] = bVar1 ^ bVar2;
        iv[uVar4] = bVar1 ^ bVar2;
        uVar4 = (ulong)((int)uVar4 + 1U & 0xf);
        sVar5 = sVar5 + 1;
      } while (length != sVar5);
    }
    *iv_off = uVar4;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int mbedtls_aes_crypt_cfb128( mbedtls_aes_context *ctx,
                       int mode,
                       size_t length,
                       size_t *iv_off,
                       unsigned char iv[16],
                       const unsigned char *input,
                       unsigned char *output )
{
    int c;
    size_t n;

    AES_VALIDATE_RET( ctx != NULL );
    AES_VALIDATE_RET( mode == MBEDTLS_AES_ENCRYPT ||
                      mode == MBEDTLS_AES_DECRYPT );
    AES_VALIDATE_RET( iv_off != NULL );
    AES_VALIDATE_RET( iv != NULL );
    AES_VALIDATE_RET( input != NULL );
    AES_VALIDATE_RET( output != NULL );

    n = *iv_off;

    if( n > 15 )
        return( MBEDTLS_ERR_AES_BAD_INPUT_DATA );

    if( mode == MBEDTLS_AES_DECRYPT )
    {
        while( length-- )
        {
            if( n == 0 )
                mbedtls_aes_crypt_ecb( ctx, MBEDTLS_AES_ENCRYPT, iv, iv );

            c = *input++;
            *output++ = (unsigned char)( c ^ iv[n] );
            iv[n] = (unsigned char) c;

            n = ( n + 1 ) & 0x0F;
        }
    }
    else
    {
        while( length-- )
        {
            if( n == 0 )
                mbedtls_aes_crypt_ecb( ctx, MBEDTLS_AES_ENCRYPT, iv, iv );

            iv[n] = *output++ = (unsigned char)( iv[n] ^ *input++ );

            n = ( n + 1 ) & 0x0F;
        }
    }

    *iv_off = n;

    return( 0 );
}